

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O3

void __thiscall t_php_generator::generate_program_header(t_php_generator *this,ostream *file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  ostream *poVar3;
  string local_60;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(file,"<?php",5);
  std::__ostream_insert<char,std::char_traits<char>>
            (file,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  php_namespace_suffix_abi_cxx11_
            (&local_60,this,(this->super_t_oop_generator).super_t_generator.program_);
  sVar2 = local_60._M_string_length;
  paVar1 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (sVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(file,"namespace ",10);
    php_namespace_suffix_abi_cxx11_
              (&local_60,this,(this->super_t_oop_generator).super_t_generator.program_);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (file,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_60,this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (file,local_60._M_dataplus._M_p,local_60._M_string_length);
  php_includes_abi_cxx11_(&local_40,this);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (file,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_php_generator::generate_program_header(std::ostream& file) {
  file << "<?php" << endl;
  if (!php_namespace_suffix(get_program()).empty()) {
    file << "namespace " << php_namespace_suffix(get_program()) << ";" << endl
         << endl;
  }
  file << autogen_comment() << php_includes();

  file << endl;
}